

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int POOL_tryAdd(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
  iVar1 = isQueueFull(ctx);
  if (iVar1 == 0) {
    POOL_add_internal(ctx,function,opaque);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  return (uint)(iVar1 == 0);
}

Assistant:

int POOL_tryAdd(POOL_ctx* ctx, POOL_function function, void* opaque)
{
    assert(ctx != NULL);
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    if (isQueueFull(ctx)) {
        ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        return 0;
    }
    POOL_add_internal(ctx, function, opaque);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return 1;
}